

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

uint64_t __thiscall cmLocalGenerator::GetBackwardsCompatibility(cmLocalGenerator *this)

{
  cmMakefile *this_00;
  int iVar1;
  char *pcVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint minor;
  uint major;
  uint local_4c;
  uint local_48;
  int local_44;
  string local_40;
  
  if (this->BackwardsCompatibilityFinal == true) {
    return this->BackwardsCompatibility;
  }
  local_44 = 0;
  local_4c = 0;
  local_48 = 0;
  this_00 = this->Makefile;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"CMAKE_BACKWARDS_COMPATIBILITY","");
  pcVar2 = cmMakefile::GetDefinition(this_00,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (pcVar2 != (char *)0x0) {
    uVar4 = 0;
    iVar1 = __isoc99_sscanf(pcVar2,"%u.%u.%u",&local_44,&local_4c,&local_48);
    if (iVar1 != 1) {
      if (iVar1 != 2) {
        uVar4 = (ulong)(local_48 % 100000000);
      }
      goto LAB_002b2101;
    }
    local_4c = 0;
  }
  uVar4 = 0;
LAB_002b2101:
  uVar3 = ((ulong)(local_4c % 1000) + (ulong)(uint)(local_44 * 1000)) * 100000000 + uVar4;
  this->BackwardsCompatibility = uVar3;
  this->BackwardsCompatibilityFinal = true;
  return uVar3;
}

Assistant:

KWIML_INT_uint64_t cmLocalGenerator::GetBackwardsCompatibility()
{
  // The computed version may change until the project is fully
  // configured.
  if (!this->BackwardsCompatibilityFinal) {
    unsigned int major = 0;
    unsigned int minor = 0;
    unsigned int patch = 0;
    if (const char* value =
          this->Makefile->GetDefinition("CMAKE_BACKWARDS_COMPATIBILITY")) {
      switch (sscanf(value, "%u.%u.%u", &major, &minor, &patch)) {
        case 2:
          patch = 0;
          break;
        case 1:
          minor = 0;
          patch = 0;
          break;
        default:
          break;
      }
    }
    this->BackwardsCompatibility = CMake_VERSION_ENCODE(major, minor, patch);
    this->BackwardsCompatibilityFinal = true;
  }

  return this->BackwardsCompatibility;
}